

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_buffer_get_byteLength(JSContext *ctx,JSValue this_val,int class_id)

{
  uint uVar1;
  JSValue JVar2;
  uint *puVar3;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSValue JVar4;
  JSArrayBuffer *abuf;
  JSValue v;
  undefined4 in_stack_ffffffffffffff90;
  int32_t iVar5;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 uStack_c;
  
  JVar4.tag._0_4_ = in_stack_ffffffffffffff90;
  JVar4.u = (JSValueUnion)in_RDX;
  JVar4.tag._4_4_ = in_stack_ffffffffffffff94;
  puVar3 = (uint *)JS_GetOpaque2(in_RSI,JVar4,(JSClassID)((ulong)in_RDI >> 0x20));
  if (puVar3 == (uint *)0x0) {
    iVar5 = 0;
    local_68 = 6;
  }
  else {
    uVar1 = *puVar3;
    if (uVar1 < 0x80000000) {
      local_30._4_4_ = uStack_c;
      local_30._0_4_ = uVar1;
      local_28 = 0;
    }
    else {
      JVar4 = __JS_NewFloat64(in_RDI,(double)uVar1);
      local_60 = JVar4.u;
      local_30 = local_60;
      local_58 = JVar4.tag;
      local_28 = local_58;
    }
    iVar5 = (int32_t)local_30;
    in_stack_ffffffffffffff94 = local_30._4_4_;
    local_68 = local_28;
  }
  JVar2.u._4_4_ = in_stack_ffffffffffffff94;
  JVar2.u.int32 = iVar5;
  JVar2.tag = local_68;
  return JVar2;
}

Assistant:

static JSValue js_array_buffer_get_byteLength(JSContext *ctx,
                                              JSValueConst this_val,
                                              int class_id)
{
    JSArrayBuffer *abuf = JS_GetOpaque2(ctx, this_val, class_id);
    if (!abuf)
        return JS_EXCEPTION;
    /* return 0 if detached */
    return JS_NewUint32(ctx, abuf->byte_length);
}